

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

void * ubloxNMEAThread(void *pParam)

{
  int iVar1;
  undefined1 local_408 [8];
  NMEADATA nmeadata;
  int err;
  int res;
  int id;
  UBLOX *publox;
  void *pParam_local;
  
  err = 0;
  nmeadata.AIS_COG._4_4_ = 0;
  do {
    if (addrsublox[err] == pParam) {
      memset(local_408,0,0x3d8);
      do {
        iVar1 = GetNMEASentenceublox((UBLOX *)pParam,(NMEADATA *)local_408);
        if (iVar1 != 0) {
          nmeadata.AIS_COG._4_4_ = iVar1;
        }
        EnterCriticalSection(ubloxCS + err);
        memcpy(nmeadataublox + err,local_408,0x3d8);
        resublox[err] = nmeadata.AIS_COG._4_4_;
        LeaveCriticalSection(ubloxCS + err);
      } while (bExitNMEAublox[err] == 0);
      return (void *)0x0;
    }
    err = err + 1;
  } while (err < 0x10);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE ubloxNMEAThread(void* pParam)
{
	UBLOX* publox = (UBLOX*)pParam;
	int id = 0, res = EXIT_FAILURE, err = EXIT_SUCCESS;
	NMEADATA nmeadata;

	while (addrsublox[id] != publox)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return 0;
	}

	memset(&nmeadata, 0, sizeof(NMEADATA));
	for (;;)
	{
		//mSleep(publox->threadperiod);
		//memset(&nmeadata, 0, sizeof(NMEADATA));
		res = GetNMEASentenceublox(publox, &nmeadata);
		if (res != EXIT_SUCCESS) err = res;
		//if (GetNMEASentenceublox(publox, &nmeadata) == EXIT_SUCCESS)
		{
			EnterCriticalSection(&ubloxCS[id]);
			nmeadataublox[id] = nmeadata;
			resublox[id] = err;
			LeaveCriticalSection(&ubloxCS[id]);
		}
		if (bExitNMEAublox[id]) break;
	}

	return 0;
}